

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_node<std::istream,short,unsigned_int>
               (ImputeNode *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  size_t n_els;
  vector<double,_std::allocator<double>_> *vec;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t veclen;
  size_t data_sizets [5];
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_type local_40;
  size_t local_38;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_int>(&local_58,5,in,buffer,diff_endian);
    node->parent = local_58;
    read_bytes<double>(&node->num_sum,local_50,in);
    if (diff_endian) {
      deserialize_node<std::istream,short,unsigned_int>();
    }
    else {
      read_bytes<double>(&node->num_weight,local_48,in);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&node->cat_sum,local_40);
    if (local_40 != 0) {
      pvVar1 = (node->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (vec = (node->cat_sum).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; vec != pvVar1; vec = vec + 1) {
        read_bytes<unsigned_long,unsigned_int>(&local_60,1,in,buffer,diff_endian);
        n_els = local_60;
        read_bytes<double>(vec,local_60,in);
        if (diff_endian) {
          swap_endianness<double>
                    ((vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,n_els);
        }
      }
    }
    if ((node->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (node->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
      ::_S_do_it(&node->cat_sum);
    }
    read_bytes<double>(&node->cat_weight,local_38,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_38);
    }
  }
  return;
}

Assistant:

void deserialize_node(ImputeNode &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t data_sizets[5];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)5, in, buffer, diff_endian);
    node.parent = data_sizets[0];

    read_bytes<double, double>(node.num_sum, data_sizets[1], in, buffer, diff_endian);

    read_bytes<double, double>(node.num_weight, data_sizets[2], in, buffer, diff_endian);

    node.cat_sum.resize(data_sizets[3]);
    if (data_sizets[3]) {
        size_t veclen;
        for (auto &v : node.cat_sum) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
            read_bytes<double, double>(v, veclen, in, buffer, diff_endian);
        }
    }
    node.cat_sum.shrink_to_fit();

    read_bytes<double, double>(node.cat_weight, data_sizets[4], in, buffer, diff_endian);
}